

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# remote_server.cpp
# Opt level: O1

void GetRequestHandler(CManager cm,CMConnection conn,void *vevent,void *client_data,attr_list attrs)

{
  AnonADIOSFile *f;
  mapped_type *ppAVar1;
  ulong uVar2;
  GetRequestMsg GetMsg;
  DataType TypeOfVar;
  string VarName;
  GetRequestMsg local_58;
  DataType local_4c;
  string local_48;
  
  local_48._M_dataplus._M_p = *(pointer *)((long)vevent + 8);
  local_58 = (GetRequestMsg)vevent;
  ppAVar1 = std::__detail::
            _Map_base<unsigned_long,_std::pair<const_unsigned_long,_AnonADIOSFile_*>,_std::allocator<std::pair<const_unsigned_long,_AnonADIOSFile_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_AnonADIOSFile_*>,_std::allocator<std::pair<const_unsigned_long,_AnonADIOSFile_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)&ADIOSFileMap,(key_type *)&local_48);
  f = *ppAVar1;
  last_service_time.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  if (f->m_mode == RemoteOpen) {
    if (f->currentStep == -1) {
      adios2::core::Engine::BeginStep();
      f->currentStep = f->currentStep + 1;
    }
    uVar2 = (**(code **)(*(long *)f->m_engine + 0x20))();
    if (uVar2 < local_58->Step) {
      do {
        if (1 < verbose) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Advancing a step",0x10);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
          std::ostream::put(-0x18);
          std::ostream::flush();
        }
        (**(code **)(*(long *)f->m_engine + 0x28))();
        adios2::core::Engine::BeginStep();
        f->currentStep = f->currentStep + 1;
        uVar2 = (**(code **)(*(long *)f->m_engine + 0x20))();
      } while (uVar2 < local_58->Step);
    }
  }
  std::__cxx11::string::string((string *)&local_48,local_58->VarName,(allocator *)&local_4c);
  local_4c = adios2::core::IO::InquireVariableType((string *)f->m_io);
  switch(local_4c) {
  case Int8:
    PrepareResponseForGet<signed_char>
              (conn,(Remote_evpath_state *)client_data,&local_58,&local_48,local_4c,f);
    break;
  case Int16:
    PrepareResponseForGet<short>
              (conn,(Remote_evpath_state *)client_data,&local_58,&local_48,local_4c,f);
    break;
  case Int32:
    PrepareResponseForGet<int>
              (conn,(Remote_evpath_state *)client_data,&local_58,&local_48,local_4c,f);
    break;
  case Int64:
    PrepareResponseForGet<long>
              (conn,(Remote_evpath_state *)client_data,&local_58,&local_48,local_4c,f);
    break;
  case UInt8:
    PrepareResponseForGet<unsigned_char>
              (conn,(Remote_evpath_state *)client_data,&local_58,&local_48,local_4c,f);
    break;
  case UInt16:
    PrepareResponseForGet<unsigned_short>
              (conn,(Remote_evpath_state *)client_data,&local_58,&local_48,local_4c,f);
    break;
  case UInt32:
    PrepareResponseForGet<unsigned_int>
              (conn,(Remote_evpath_state *)client_data,&local_58,&local_48,local_4c,f);
    break;
  case UInt64:
    PrepareResponseForGet<unsigned_long>
              (conn,(Remote_evpath_state *)client_data,&local_58,&local_48,local_4c,f);
    break;
  case Float:
    PrepareResponseForGet<float>
              (conn,(Remote_evpath_state *)client_data,&local_58,&local_48,local_4c,f);
    break;
  case Double:
    PrepareResponseForGet<double>
              (conn,(Remote_evpath_state *)client_data,&local_58,&local_48,local_4c,f);
    break;
  case LongDouble:
    PrepareResponseForGet<long_double>
              (conn,(Remote_evpath_state *)client_data,&local_58,&local_48,local_4c,f);
    break;
  case FloatComplex:
    PrepareResponseForGet<std::complex<float>>
              (conn,(Remote_evpath_state *)client_data,&local_58,&local_48,local_4c,f);
    break;
  case DoubleComplex:
    PrepareResponseForGet<std::complex<double>>
              (conn,(Remote_evpath_state *)client_data,&local_58,&local_48,local_4c,f);
    break;
  case Char:
    PrepareResponseForGet<char>
              (conn,(Remote_evpath_state *)client_data,&local_58,&local_48,local_4c,f);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  return;
}

Assistant:

static void GetRequestHandler(CManager cm, CMConnection conn, void *vevent, void *client_data,
                              attr_list attrs)
{
    GetRequestMsg GetMsg = static_cast<GetRequestMsg>(vevent);
    AnonADIOSFile *f = ADIOSFileMap[GetMsg->FileHandle];
    struct Remote_evpath_state *ev_state = static_cast<struct Remote_evpath_state *>(client_data);
    last_service_time = std::chrono::steady_clock::now();
    if (f->m_mode == RemoteOpen)
    {
        if (f->currentStep == -1)
        {
            f->m_engine->BeginStep();
            f->currentStep++;
        }
        while (f->m_engine->CurrentStep() < GetMsg->Step)
        {
            if (verbose >= 2)
                std::cout << "Advancing a step" << std::endl;
            f->m_engine->EndStep();
            f->m_engine->BeginStep();
            f->currentStep++;
        }
    }

    std::string VarName = std::string(GetMsg->VarName);
    adios2::DataType TypeOfVar = f->m_io->InquireVariableType(VarName);

    try
    {
        if (TypeOfVar == adios2::DataType::None)
        {
        }
#define GET(T)                                                                                     \
    else if (TypeOfVar == helper::GetDataType<T>())                                                \
    {                                                                                              \
        PrepareResponseForGet<T>(conn, ev_state, std::ref(GetMsg), std::ref(VarName), TypeOfVar,   \
                                 f);                                                               \
    }
        ADIOS2_FOREACH_PRIMITIVE_STDTYPE_1ARG(GET)
#undef GET
    }
    catch (const std::exception &exc)
    {
        if (verbose)
            std::cout << "Returning exception " << exc.what() << " for Get<" << TypeOfVar << ">("
                      << VarName << ")" << std::endl;
    }
}